

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
dynet::detail::f<dynet::Concatenate,std::initializer_list<dynet::Expression>,unsigned_int>
          (initializer_list<dynet::Expression> *xs,uint *arg1)

{
  Expression *this;
  const_iterator pg_00;
  const_iterator pEVar1;
  reference pvVar2;
  initializer_list<dynet::Expression> *in_RDI;
  const_iterator xi;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  ComputationGraph *pg;
  undefined4 in_stack_ffffffffffffff80;
  VariableIndex in_stack_ffffffffffffff84;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  const_iterator pEVar3;
  int local_58;
  uint *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  ComputationGraph *in_stack_ffffffffffffffc0;
  Expression local_10;
  
  std::initializer_list<dynet::Expression>::begin(in_RDI);
  this = (Expression *)std::initializer_list<dynet::Expression>::size(in_RDI);
  __n = &stack0xffffffffffffffbf;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1777d1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffa0,(size_type)__n,(allocator_type *)this);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1777f1);
  local_58 = 0;
  pg_00 = std::initializer_list<dynet::Expression>::begin(in_RDI);
  while( true ) {
    pEVar3 = pg_00;
    pEVar1 = std::initializer_list<dynet::Expression>::end
                       ((initializer_list<dynet::Expression> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (pg_00 == pEVar1) break;
    in_stack_ffffffffffffff84 = pEVar3->i;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffc0,(long)local_58);
    *pvVar2 = in_stack_ffffffffffffff84;
    pg_00 = pEVar3 + 1;
    local_58 = local_58 + 1;
  }
  ComputationGraph::
  add_function<dynet::Concatenate,std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int_const&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Expression::Expression(this,(ComputationGraph *)pg_00,in_stack_ffffffffffffff84);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return local_10;
}

Assistant:

Expression f(const T& xs, const T1& arg1) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis, arg1));
}